

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::reserve
          (vector<crnlib::vector<unsigned_int>_> *this,uint new_capacity)

{
  vector<unsigned_int> *pvVar1;
  ulong uVar2;
  void *p;
  long lVar3;
  vector<crnlib::vector<unsigned_int>_> local_28;
  
  if (this->m_capacity < new_capacity) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,new_capacity,false,0x10,(object_mover)0x0,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_28.m_p = (vector<unsigned_int> *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,new_capacity,false,0x10,(object_mover)0x0,false);
    operator=(&local_28,this);
    pvVar1 = this->m_p;
    this->m_p = local_28.m_p;
    uVar2._0_4_ = this->m_size;
    uVar2._4_4_ = this->m_capacity;
    this->m_size = local_28.m_size;
    this->m_capacity = local_28.m_capacity;
    local_28.m_size = (undefined4)uVar2;
    local_28.m_capacity = uVar2._4_4_;
    local_28.m_p = pvVar1;
    if (pvVar1 != (vector<unsigned_int> *)0x0) {
      if ((undefined4)uVar2 != 0) {
        lVar3 = 0;
        do {
          p = *(void **)((long)&pvVar1->m_p + lVar3);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar3 = lVar3 + 0x10;
        } while ((uVar2 & 0xffffffff) << 4 != lVar3);
      }
      crnlib_free(local_28.m_p);
    }
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity) {
    if (new_capacity > m_capacity)
      increase_capacity(new_capacity, false);
    else if (new_capacity < m_capacity) {
      // Must work around the lack of a "decrease_capacity()" method.
      // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
      vector tmp;
      tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
      tmp = *this;
      swap(tmp);
    }
  }